

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::CIBuildOnlyReporter::CIBuildOnlyReporter
          (CIBuildOnlyReporter *this,shared_ptr<ApprovalTests::Reporter> *reporter)

{
  shared_ptr<ApprovalTests::Reporter> *in_RDI;
  shared_ptr<ApprovalTests::Reporter> *in_stack_ffffffffffffffd8;
  
  Reporter::Reporter((Reporter *)in_RDI);
  (in_RDI->super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__CIBuildOnlyReporter_001c2b98;
  ::std::shared_ptr<ApprovalTests::Reporter>::shared_ptr(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

CIBuildOnlyReporter::CIBuildOnlyReporter(std::shared_ptr<Reporter> reporter)
        : m_reporter(reporter)
    {
    }